

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_std_file_getline(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  FILE *__stream;
  undefined4 in_ECX;
  char *in_R8;
  JSValue JVar2;
  JSValue obj;
  DynBuf dbuf;
  int c;
  FILE *f;
  undefined1 in_stack_ffffffffffffff68 [16];
  JSContext *in_stack_ffffffffffffff78;
  JSValueUnion in_stack_ffffffffffffff80;
  int64_t in_stack_ffffffffffffff88;
  long local_70;
  undefined4 in_stack_ffffffffffffffd0;
  JSValueUnion local_10;
  int64_t local_8;
  
  JVar2.tag = in_stack_ffffffffffffff88;
  JVar2.u.float64 = in_stack_ffffffffffffff80.float64;
  __stream = (FILE *)js_std_file_get(in_stack_ffffffffffffff78,JVar2);
  if (__stream == (FILE *)0x0) {
    local_10.ptr = (void *)(local_10 << 0x20);
    local_8 = 6;
  }
  else {
    js_std_dbuf_init(in_stack_ffffffffffffff68._8_8_,in_stack_ffffffffffffff68._0_8_);
    do {
      iVar1 = fgetc(__stream);
      if (iVar1 == -1) {
        if (local_70 == 0) {
          dbuf_free((DynBuf *)0x10f428);
          local_10.ptr = (void *)(local_10 << 0x20);
          local_8 = 2;
          return _local_10;
        }
LAB_0010f490:
        JVar2 = JS_NewStringLen((JSContext *)CONCAT44(in_ECX,in_stack_ffffffffffffffd0),in_R8,
                                (size_t)__stream);
        local_10 = JVar2.u;
        local_8 = JVar2.tag;
        dbuf_free((DynBuf *)0x10f4ca);
        return _local_10;
      }
      if (iVar1 == 10) goto LAB_0010f490;
      iVar1 = dbuf_putc(in_stack_ffffffffffffff68._8_8_,in_stack_ffffffffffffff68[7]);
    } while (iVar1 == 0);
    dbuf_free((DynBuf *)0x10f46f);
    _local_10 = JS_ThrowOutOfMemory((JSContext *)in_stack_ffffffffffffff80.ptr);
  }
  return _local_10;
}

Assistant:

static JSValue js_std_file_getline(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv)
{
    FILE *f = js_std_file_get(ctx, this_val);
    int c;
    DynBuf dbuf;
    JSValue obj;
    
    if (!f)
        return JS_EXCEPTION;

    js_std_dbuf_init(ctx, &dbuf);
    for(;;) {
        c = fgetc(f);
        if (c == EOF) {
            if (dbuf.size == 0) {
                /* EOF */
                dbuf_free(&dbuf);
                return JS_NULL;
            } else {
                break;
            }
        }
        if (c == '\n')
            break;
        if (dbuf_putc(&dbuf, c)) {
            dbuf_free(&dbuf);
            return JS_ThrowOutOfMemory(ctx);
        }
    }
    obj = JS_NewStringLen(ctx, (const char *)dbuf.buf, dbuf.size);
    dbuf_free(&dbuf);
    return obj;
}